

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demangle_rust.cc
# Opt level: O1

bool __thiscall
absl::lts_20250127::debugging_internal::anon_unknown_0::RustSymbolParser::
ParseUndisambiguatedIdentifier(RustSymbolParser *this,char uppercase_namespace,int disambiguator)

{
  long lVar1;
  char cVar2;
  byte bVar3;
  byte *pbVar4;
  Nullable<char_*> pcVar5;
  int iVar6;
  long lVar7;
  int iVar8;
  int iVar9;
  char *pcVar10;
  char *pcVar11;
  bool bVar12;
  char digits [12];
  undefined4 local_30;
  
  pcVar10 = this->encoding_;
  cVar2 = pcVar10[this->pos_];
  if (cVar2 == 'u') {
    this->pos_ = this->pos_ + 1;
  }
  iVar6 = this->pos_;
  lVar7 = (long)iVar6;
  iVar9 = 0;
  if (9 < (byte)(pcVar10[lVar7] - 0x30U)) goto LAB_002dd21e;
  lVar1 = lVar7 + 1;
  this->pos_ = (int)lVar1;
  iVar8 = pcVar10[lVar7] + -0x30;
  if (iVar8 == 0) {
    bVar12 = true;
  }
  else {
    bVar12 = (byte)(pcVar10[lVar1] - 0x30U) < 10;
    if (bVar12) {
      iVar6 = iVar6 + 2;
      pcVar11 = pcVar10 + lVar1;
      do {
        this->pos_ = iVar6;
        iVar8 = (int)*pcVar11 + iVar8 * 10 + -0x30;
        bVar12 = (byte)(pcVar11[1] - 0x30U) < 10;
        if (!bVar12) break;
        iVar6 = iVar6 + 1;
        pcVar11 = pcVar11 + 1;
      } while (iVar8 < 0xccccccc);
    }
    iVar9 = -1;
    if (!bVar12) {
      iVar9 = iVar8;
    }
    bVar12 = (bool)(bVar12 ^ 1);
  }
  if (!bVar12) goto LAB_002dd21c;
  if (pcVar10[this->pos_] == '_') {
    this->pos_ = this->pos_ + 1;
  }
  if (cVar2 == 'u') {
    pcVar5 = DecodeRustPunycode((DecodeRustPunycodeOptions)_digits);
    this->out_ = pcVar5;
    if (pcVar5 == (Nullable<char_*>)0x0) goto LAB_002dd21c;
    this->pos_ = this->pos_ + iVar9;
  }
  if (uppercase_namespace != '\0') {
    if (uppercase_namespace == 'S') {
      pcVar10 = "{shim";
LAB_002dcfab:
      bVar12 = Emit(this,pcVar10);
      if (!bVar12) goto LAB_002dd21c;
    }
    else {
      if (uppercase_namespace == 'C') {
        pcVar10 = "{closure";
        goto LAB_002dcfab;
      }
      if (this->silence_depth_ < 1) {
        pcVar10 = this->out_;
        if ((long)this->out_end_ - (long)pcVar10 < 2) goto LAB_002dd21c;
        this->out_ = pcVar10 + 1;
        *pcVar10 = '{';
        *this->out_ = '\0';
      }
      if (this->silence_depth_ < 1) {
        pcVar10 = this->out_;
        if ((long)this->out_end_ - (long)pcVar10 < 2) goto LAB_002dd21c;
        this->out_ = pcVar10 + 1;
        *pcVar10 = uppercase_namespace;
        *this->out_ = '\0';
      }
    }
    if ((0 < iVar9) && (bVar12 = Emit(this,":"), !bVar12)) goto LAB_002dd21c;
  }
  if ((cVar2 != 'u') && (0 < iVar9)) {
    do {
      iVar6 = this->pos_;
      this->pos_ = iVar6 + 1;
      bVar3 = this->encoding_[iVar6];
      if ((-1 < (char)bVar3) &&
         (0x19 < (byte)((bVar3 & 0xdf) + 0xbf) && (bVar3 != 0x5f && (byte)(bVar3 - 0x3a) < 0xf6)))
      goto LAB_002dd21c;
      if (this->silence_depth_ < 1) {
        pbVar4 = (byte *)this->out_;
        if ((long)this->out_end_ - (long)pbVar4 < 2) goto LAB_002dd21c;
        this->out_ = (char *)(pbVar4 + 1);
        *pbVar4 = bVar3;
        *this->out_ = '\0';
      }
      iVar9 = iVar9 + -1;
    } while (iVar9 != 0);
  }
  iVar9 = 1;
  if (uppercase_namespace == '\0') goto LAB_002dd21e;
  if (this->silence_depth_ < 1) {
    pcVar10 = this->out_;
    if ((long)this->out_end_ - (long)pcVar10 < 2) goto LAB_002dd21c;
    this->out_ = pcVar10 + 1;
    *pcVar10 = '#';
    *this->out_ = '\0';
  }
  if (disambiguator < 0) {
    if (this->silence_depth_ < 1) {
      pcVar10 = this->out_;
      if ((long)this->out_end_ - (long)pcVar10 < 2) goto LAB_002dd21c;
      this->out_ = pcVar10 + 1;
      *pcVar10 = '?';
LAB_002dd1f6:
      *this->out_ = '\0';
    }
LAB_002dd1fc:
    if (0 < this->silence_depth_) goto LAB_002dd21e;
    pcVar10 = this->out_;
    if (1 < (long)this->out_end_ - (long)pcVar10) {
      this->out_ = pcVar10 + 1;
      *pcVar10 = '}';
      *this->out_ = '\0';
      goto LAB_002dd21e;
    }
  }
  else if (disambiguator == 0) {
    if (0 < this->silence_depth_) goto LAB_002dd1fc;
    pcVar10 = this->out_;
    if (1 < (long)this->out_end_ - (long)pcVar10) {
      this->out_ = pcVar10 + 1;
      *pcVar10 = '0';
      goto LAB_002dd1f6;
    }
  }
  else {
    pcVar10 = (char *)((long)&local_30 + 3);
    local_30 = 0;
    do {
      pcVar10[-1] = (char)disambiguator + (char)((uint)disambiguator / 10) * -10 | 0x30;
      pcVar10 = pcVar10 + -1;
      bVar12 = 9 < (uint)disambiguator;
      disambiguator = (uint)disambiguator / 10;
    } while (bVar12);
    bVar12 = Emit(this,pcVar10);
    if (bVar12) goto LAB_002dd1fc;
  }
LAB_002dd21c:
  iVar9 = 0;
LAB_002dd21e:
  return SUB41(iVar9,0);
}

Assistant:

ABSL_MUST_USE_RESULT bool ParseUndisambiguatedIdentifier(
      char uppercase_namespace = '\0', int disambiguator = 0) {
    // undisambiguated-identifier -> u? decimal-number _? bytes
    const bool is_punycoded = Eat('u');
    if (!IsDigit(Peek())) return false;
    int num_bytes = 0;
    if (!ParseDecimalNumber(num_bytes)) return false;
    (void)Eat('_');  // optional separator, needed if a digit follows
    if (is_punycoded) {
      DecodeRustPunycodeOptions options;
      options.punycode_begin = &encoding_[pos_];
      options.punycode_end = &encoding_[pos_] + num_bytes;
      options.out_begin = out_;
      options.out_end = out_end_;
      out_ = DecodeRustPunycode(options);
      if (out_ == nullptr) return false;
      pos_ += static_cast<size_t>(num_bytes);
    }

    // Emit the beginnings of braced forms like {shim:vtable#0}.
    if (uppercase_namespace != '\0') {
      switch (uppercase_namespace) {
        case 'C':
          if (!Emit("{closure")) return false;
          break;
        case 'S':
          if (!Emit("{shim")) return false;
          break;
        default:
          if (!EmitChar('{') || !EmitChar(uppercase_namespace)) return false;
          break;
      }
      if (num_bytes > 0 && !Emit(":")) return false;
    }

    // Emit the name itself.
    if (!is_punycoded) {
      for (int i = 0; i < num_bytes; ++i) {
        const char c = Take();
        if (!IsIdentifierChar(c) &&
            // The spec gives toolchains the choice of Punycode or raw UTF-8 for
            // identifiers containing code points above 0x7f, so accept bytes
            // with the high bit set.
            (c & 0x80) == 0) {
          return false;
        }
        if (!EmitChar(c)) return false;
      }
    }

    // Emit the endings of braced forms, e.g., "#42}".
    if (uppercase_namespace != '\0') {
      if (!EmitChar('#')) return false;
      if (!EmitDisambiguator(disambiguator)) return false;
      if (!EmitChar('}')) return false;
    }

    return true;
  }